

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_collider.cpp
# Opt level: O1

void __thiscall
embree::sse2::BVHNCollider<4>::collide_recurse_entry
          (BVHNCollider<4> *this,NodeRef ref0,BBox3fa *bounds0,NodeRef ref1,BBox3fa *bounds1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  BBox3fa *pBVar3;
  Vec3fa *pVVar4;
  size_t *psVar5;
  size_t sVar6;
  ulong uVar7;
  unsigned_long last;
  undefined8 uVar8;
  ulong uVar9;
  void *ptr;
  char cVar10;
  long lVar11;
  CollideJob *pCVar12;
  void *pvVar13;
  runtime_error *this_00;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  size_t sVar18;
  CollideJob *pCVar19;
  size_t sVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  jobvector jobs [2];
  task_group_context context;
  undefined1 *apuStack_190 [2];
  int local_180;
  auto_partitioner local_179;
  jobvector local_178;
  ulong local_150;
  ulong local_148;
  void *local_140;
  int local_134;
  BVHNCollider<4> *local_130;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  long local_e8;
  size_t local_e0;
  anon_class_24_3_c7c30120 local_d8;
  anon_class_8_1_898bcfc2_conflict12 local_c0;
  task_group_context local_b8;
  
  local_130 = this;
  lVar11 = 8;
  do {
    *(undefined8 *)(&local_178.field_0x0 + lVar11) = 0;
    sVar6 = local_178.size_active;
    *(undefined8 *)((long)&local_178.size_active + lVar11) = 0;
    *(undefined8 *)((long)&local_178.size_alloced + lVar11) = 0;
    pCVar19 = local_178.items;
    lVar11 = lVar11 + 0x20;
  } while (lVar11 != 0x48);
  if (local_178.size_alloced < 0x800) {
    apuStack_190[0] = (undefined1 *)0xc86e2c;
    pCVar12 = (CollideJob *)alignedMalloc(0x38000,0x10);
    if (local_178.size_active != 0) {
      lVar11 = 0x60;
      uVar14 = 0;
      do {
        *(undefined8 *)((long)pCVar12 + lVar11 + -0x60) =
             *(undefined8 *)((long)local_178.items + lVar11 + -0x60);
        puVar1 = (undefined8 *)((long)local_178.items + lVar11 + -0x50);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)pCVar12 + lVar11 + -0x50);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)local_178.items + lVar11 + -0x40);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)pCVar12 + lVar11 + -0x40);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)local_178.items + lVar11 + -0x30);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)pCVar12 + lVar11 + -0x30);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)local_178.items + lVar11 + -0x20);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)pCVar12 + lVar11 + -0x20);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)local_178.items + lVar11 + -0x10);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)pCVar12 + lVar11 + -0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        *(undefined8 *)((long)&(pCVar12->ref0).ptr + lVar11) =
             *(undefined8 *)((long)&((local_178.items)->ref0).ptr + lVar11);
        uVar14 = uVar14 + 1;
        lVar11 = lVar11 + 0x70;
      } while (uVar14 < local_178.size_active);
    }
    apuStack_190[0] = (undefined1 *)0xc86ea0;
    local_178.items = pCVar12;
    alignedFree(pCVar19);
    local_178.size_alloced = 0x800;
  }
  ptr = local_140;
  uVar14 = local_150;
  local_178.size_active = sVar6;
  if (local_148 < 0x800) {
    apuStack_190[0] = (undefined1 *)0xc86ed6;
    pvVar13 = alignedMalloc(0x38000,0x10);
    if (local_150 != 0) {
      lVar11 = 0x60;
      uVar15 = 0;
      do {
        *(undefined8 *)((long)pvVar13 + lVar11 + -0x60) =
             *(undefined8 *)((long)local_140 + lVar11 + -0x60);
        puVar1 = (undefined8 *)((long)local_140 + lVar11 + -0x50);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)pvVar13 + lVar11 + -0x50);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)local_140 + lVar11 + -0x40);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)pvVar13 + lVar11 + -0x40);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)local_140 + lVar11 + -0x30);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)pvVar13 + lVar11 + -0x30);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)local_140 + lVar11 + -0x20);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)pvVar13 + lVar11 + -0x20);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)local_140 + lVar11 + -0x10);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)pvVar13 + lVar11 + -0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        *(undefined8 *)((long)pvVar13 + lVar11) = *(undefined8 *)((long)local_140 + lVar11);
        uVar15 = uVar15 + 1;
        lVar11 = lVar11 + 0x70;
      } while (uVar15 < local_150);
    }
    apuStack_190[0] = (undefined1 *)0xc86f4a;
    local_140 = pvVar13;
    alignedFree(ptr);
    local_150 = uVar14;
    local_148 = 0x800;
  }
  pCVar19 = local_178.items;
  sVar6 = local_178.size_active;
  uVar14 = local_178.size_active + 1;
  sVar18 = local_178.size_alloced;
  if ((local_178.size_alloced < uVar14) &&
     (sVar18 = uVar14, uVar15 = local_178.size_alloced, local_178.size_alloced != 0)) {
    for (; sVar18 = uVar15, uVar15 < uVar14; uVar15 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0)) {
    }
  }
  fVar29 = (bounds0->lower).field_0.m128[0];
  fVar31 = (bounds0->lower).field_0.m128[1];
  fVar33 = (bounds0->lower).field_0.m128[2];
  fVar35 = (bounds0->lower).field_0.m128[3];
  fVar36 = (bounds0->upper).field_0.m128[0];
  fVar37 = (bounds0->upper).field_0.m128[1];
  fVar38 = (bounds0->upper).field_0.m128[2];
  fVar39 = (bounds0->upper).field_0.m128[3];
  fVar24 = (bounds1->lower).field_0.m128[0];
  fVar25 = (bounds1->lower).field_0.m128[1];
  fVar26 = (bounds1->lower).field_0.m128[2];
  fVar27 = (bounds1->lower).field_0.m128[3];
  fVar28 = (bounds1->upper).field_0.m128[0];
  fVar30 = (bounds1->upper).field_0.m128[1];
  fVar32 = (bounds1->upper).field_0.m128[2];
  fVar34 = (bounds1->upper).field_0.m128[3];
  if (local_178.size_alloced != sVar18) {
    apuStack_190[0] = (undefined1 *)0xc86fde;
    local_128 = fVar36;
    fStack_124 = fVar37;
    fStack_120 = fVar38;
    fStack_11c = fVar39;
    local_118 = fVar29;
    fStack_114 = fVar31;
    fStack_110 = fVar33;
    fStack_10c = fVar35;
    local_108 = fVar28;
    fStack_104 = fVar30;
    fStack_100 = fVar32;
    fStack_fc = fVar34;
    local_f8 = fVar24;
    fStack_f4 = fVar25;
    fStack_f0 = fVar26;
    fStack_ec = fVar27;
    local_178.items = (CollideJob *)alignedMalloc(sVar18 * 0x70,0x10);
    if (local_178.size_active != 0) {
      lVar11 = 0x60;
      uVar14 = 0;
      do {
        *(undefined8 *)((long)local_178.items + lVar11 + -0x60) =
             *(undefined8 *)((long)pCVar19 + lVar11 + -0x60);
        puVar1 = (undefined8 *)((long)pCVar19 + lVar11 + -0x50);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)local_178.items + lVar11 + -0x50);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)pCVar19 + lVar11 + -0x40);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)local_178.items + lVar11 + -0x40);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)pCVar19 + lVar11 + -0x30);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)local_178.items + lVar11 + -0x30);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)pCVar19 + lVar11 + -0x20);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)local_178.items + lVar11 + -0x20);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)pCVar19 + lVar11 + -0x10);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)local_178.items + lVar11 + -0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        *(undefined8 *)((long)&((local_178.items)->ref0).ptr + lVar11) =
             *(undefined8 *)((long)&(pCVar19->ref0).ptr + lVar11);
        uVar14 = uVar14 + 1;
        lVar11 = lVar11 + 0x70;
      } while (uVar14 < local_178.size_active);
    }
    apuStack_190[0] = (undefined1 *)0xc87056;
    alignedFree(pCVar19);
    local_178.size_alloced = sVar18;
    fVar24 = local_f8;
    fVar25 = fStack_f4;
    fVar26 = fStack_f0;
    fVar27 = fStack_ec;
    fVar28 = local_108;
    fVar30 = fStack_104;
    fVar32 = fStack_100;
    fVar34 = fStack_fc;
    fVar29 = local_118;
    fVar31 = fStack_114;
    fVar33 = fStack_110;
    fVar35 = fStack_10c;
    fVar36 = local_128;
    fVar37 = fStack_124;
    fVar38 = fStack_120;
    fVar39 = fStack_11c;
  }
  local_178.size_active = sVar6 + 1;
  local_178.items[sVar6].ref0.ptr = ref0.ptr;
  pBVar3 = &local_178.items[sVar6].bounds0;
  (pBVar3->lower).field_0.m128[0] = fVar29;
  (pBVar3->lower).field_0.m128[1] = fVar31;
  (pBVar3->lower).field_0.m128[2] = fVar33;
  (pBVar3->lower).field_0.m128[3] = fVar35;
  pBVar3 = &local_178.items[sVar6].bounds0;
  (pBVar3->upper).field_0.m128[0] = fVar36;
  (pBVar3->upper).field_0.m128[1] = fVar37;
  (pBVar3->upper).field_0.m128[2] = fVar38;
  (pBVar3->upper).field_0.m128[3] = fVar39;
  local_178.items[sVar6].depth0 = 0;
  local_178.items[sVar6].ref1.ptr = ref1.ptr;
  pBVar3 = &local_178.items[sVar6].bounds1;
  (pBVar3->lower).field_0.m128[0] = fVar24;
  (pBVar3->lower).field_0.m128[1] = fVar25;
  (pBVar3->lower).field_0.m128[2] = fVar26;
  (pBVar3->lower).field_0.m128[3] = fVar27;
  pBVar3 = &local_178.items[sVar6].bounds1;
  (pBVar3->upper).field_0.m128[0] = fVar28;
  (pBVar3->upper).field_0.m128[1] = fVar30;
  (pBVar3->upper).field_0.m128[2] = fVar32;
  (pBVar3->upper).field_0.m128[3] = fVar34;
  local_178.items[sVar6].depth1 = 0;
  local_180 = 0;
  if (sVar6 + 9 < 0x801) {
    iVar16 = 1;
    do {
      lVar11 = (long)local_180;
      uVar14 = (&local_178)[lVar11].size_active;
      lVar21 = (long)iVar16;
      if (uVar14 == 0) {
        uVar14 = 0;
        lVar23 = lVar21;
        iVar17 = iVar16;
      }
      else {
        local_134 = iVar16;
        local_e8 = lVar21;
        uVar15 = 0;
        do {
          pCVar19 = (&local_178)[lVar11].items + uVar15;
          sVar6 = (&local_178)[lVar21].size_active;
          if (((uVar14 - uVar15) + sVar6) - 0x7f9 < 0xfffffffffffff7ff) {
            sVar18 = (pCVar19->ref0).ptr;
            fVar29 = (pCVar19->bounds0).lower.field_0.m128[0];
            fVar31 = (pCVar19->bounds0).lower.field_0.m128[1];
            fVar33 = (pCVar19->bounds0).lower.field_0.m128[2];
            fVar35 = (pCVar19->bounds0).lower.field_0.m128[3];
            fVar36 = (pCVar19->bounds0).upper.field_0.m128[0];
            fVar37 = (pCVar19->bounds0).upper.field_0.m128[1];
            fVar38 = (pCVar19->bounds0).upper.field_0.m128[2];
            fVar39 = (pCVar19->bounds0).upper.field_0.m128[3];
            local_b8.my_cpu_ctl_env = pCVar19->depth0;
            local_b8._8_8_ = (pCVar19->ref1).ptr;
            uVar14 = sVar6 + 1;
            uVar7 = (&local_178)[lVar21].size_alloced;
            uVar22 = uVar7;
            if ((uVar7 < uVar14) && (uVar22 = uVar14, uVar9 = uVar7, uVar7 != 0)) {
              for (; uVar22 = uVar9, uVar9 < uVar14; uVar9 = uVar9 * 2 + (ulong)(uVar9 * 2 == 0)) {
              }
            }
            fVar24 = (pCVar19->bounds1).lower.field_0.m128[0];
            fVar25 = (pCVar19->bounds1).lower.field_0.m128[1];
            fVar26 = (pCVar19->bounds1).lower.field_0.m128[2];
            fVar27 = (pCVar19->bounds1).lower.field_0.m128[3];
            fVar28 = (pCVar19->bounds1).upper.field_0.m128[0];
            fVar30 = (pCVar19->bounds1).upper.field_0.m128[1];
            fVar32 = (pCVar19->bounds1).upper.field_0.m128[2];
            fVar34 = (pCVar19->bounds1).upper.field_0.m128[3];
            sVar20 = pCVar19->depth1;
            if (uVar7 != uVar22) {
              local_e0 = pCVar19->depth1;
              local_128 = fVar28;
              fStack_124 = fVar30;
              fStack_120 = fVar32;
              fStack_11c = fVar34;
              local_118 = fVar24;
              fStack_114 = fVar25;
              fStack_110 = fVar26;
              fStack_10c = fVar27;
              local_108 = fVar36;
              fStack_104 = fVar37;
              fStack_100 = fVar38;
              fStack_fc = fVar39;
              local_f8 = fVar29;
              fStack_f4 = fVar31;
              fStack_f0 = fVar33;
              fStack_ec = fVar35;
              pCVar19 = (&local_178)[lVar21].items;
              apuStack_190[0] = (undefined1 *)0xc871e3;
              pCVar12 = (CollideJob *)alignedMalloc(uVar22 * 0x70,0x10);
              (&local_178)[lVar21].items = pCVar12;
              if ((&local_178)[lVar21].size_active != 0) {
                lVar11 = 0x60;
                uVar14 = 0;
                do {
                  pCVar12 = (&local_178)[lVar21].items;
                  *(undefined8 *)((long)pCVar12 + lVar11 + -0x60) =
                       *(undefined8 *)((long)pCVar19 + lVar11 + -0x60);
                  puVar1 = (undefined8 *)((long)pCVar19 + lVar11 + -0x50);
                  uVar8 = puVar1[1];
                  puVar2 = (undefined8 *)((long)pCVar12 + lVar11 + -0x50);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar8;
                  puVar1 = (undefined8 *)((long)pCVar19 + lVar11 + -0x40);
                  uVar8 = puVar1[1];
                  puVar2 = (undefined8 *)((long)pCVar12 + lVar11 + -0x40);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar8;
                  puVar1 = (undefined8 *)((long)pCVar19 + lVar11 + -0x30);
                  uVar8 = puVar1[1];
                  puVar2 = (undefined8 *)((long)pCVar12 + lVar11 + -0x30);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar8;
                  puVar1 = (undefined8 *)((long)pCVar19 + lVar11 + -0x20);
                  uVar8 = puVar1[1];
                  puVar2 = (undefined8 *)((long)pCVar12 + lVar11 + -0x20);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar8;
                  puVar1 = (undefined8 *)((long)pCVar19 + lVar11 + -0x10);
                  uVar8 = puVar1[1];
                  puVar2 = (undefined8 *)((long)pCVar12 + lVar11 + -0x10);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar8;
                  *(undefined8 *)((long)&(pCVar12->ref0).ptr + lVar11) =
                       *(undefined8 *)((long)&(pCVar19->ref0).ptr + lVar11);
                  uVar14 = uVar14 + 1;
                  lVar11 = lVar11 + 0x70;
                } while (uVar14 < (&local_178)[lVar21].size_active);
              }
              apuStack_190[0] = (undefined1 *)0xc87257;
              alignedFree(pCVar19);
              (&local_178)[lVar21].size_active = sVar6;
              (&local_178)[lVar21].size_alloced = uVar22;
              sVar20 = local_e0;
              fVar29 = local_f8;
              fVar31 = fStack_f4;
              fVar33 = fStack_f0;
              fVar35 = fStack_ec;
              fVar36 = local_108;
              fVar37 = fStack_104;
              fVar38 = fStack_100;
              fVar39 = fStack_fc;
              fVar24 = local_118;
              fVar25 = fStack_114;
              fVar26 = fStack_110;
              fVar27 = fStack_10c;
              fVar28 = local_128;
              fVar30 = fStack_124;
              fVar32 = fStack_120;
              fVar34 = fStack_11c;
            }
            sVar6 = (&local_178)[lVar21].size_active;
            pCVar19 = (&local_178)[lVar21].items;
            (&local_178)[lVar21].size_active = sVar6 + 1;
            pCVar19[sVar6].ref0.ptr = sVar18;
            pBVar3 = &pCVar19[sVar6].bounds0;
            (pBVar3->lower).field_0.m128[0] = fVar29;
            (pBVar3->lower).field_0.m128[1] = fVar31;
            (pBVar3->lower).field_0.m128[2] = fVar33;
            (pBVar3->lower).field_0.m128[3] = fVar35;
            pVVar4 = &pCVar19[sVar6].bounds0.upper;
            (pVVar4->field_0).m128[0] = fVar36;
            (pVVar4->field_0).m128[1] = fVar37;
            (pVVar4->field_0).m128[2] = fVar38;
            (pVVar4->field_0).m128[3] = fVar39;
            psVar5 = &pCVar19[sVar6].depth0;
            *(undefined4 *)psVar5 = (undefined4)local_b8.my_cpu_ctl_env;
            *(undefined4 *)((long)psVar5 + 4) = local_b8.my_cpu_ctl_env._4_4_;
            *(__atomic_base<unsigned_int> *)&((NodeRef *)(psVar5 + 1))->ptr =
                 local_b8.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i;
            *(undefined4 *)((long)psVar5 + 0xc) = local_b8._12_4_;
            pBVar3 = &pCVar19[sVar6].bounds1;
            (pBVar3->lower).field_0.m128[0] = fVar24;
            (pBVar3->lower).field_0.m128[1] = fVar25;
            (pBVar3->lower).field_0.m128[2] = fVar26;
            (pBVar3->lower).field_0.m128[3] = fVar27;
            pVVar4 = &pCVar19[sVar6].bounds1.upper;
            (pVVar4->field_0).m128[0] = fVar28;
            (pVVar4->field_0).m128[1] = fVar30;
            (pVVar4->field_0).m128[2] = fVar32;
            (pVVar4->field_0).m128[3] = fVar34;
            pCVar19[sVar6].depth1 = sVar20;
          }
          else {
            apuStack_190[0] = (undefined1 *)0xc87192;
            split(local_130,pCVar19,&local_178 + lVar21);
          }
          uVar15 = uVar15 + 1;
          lVar11 = (long)local_180;
          uVar14 = (&local_178)[lVar11].size_active;
          lVar23 = local_e8;
          iVar17 = local_134;
        } while (uVar15 < uVar14);
      }
      if ((&local_178)[lVar23].size_active == uVar14) break;
      if (uVar14 != 0) {
        (&local_178)[lVar11].size_active = 0;
      }
      sVar6 = (&local_178)[lVar11].size_alloced;
      if ((&local_178)[lVar11].size_alloced == sVar6) {
        (&local_178)[lVar11].size_active = 0;
      }
      else {
        pCVar19 = (&local_178)[lVar11].items;
        apuStack_190[0] = (undefined1 *)0xc8733f;
        pCVar12 = (CollideJob *)alignedMalloc(sVar6 * 0x70,0x10);
        (&local_178)[lVar11].items = pCVar12;
        if ((&local_178)[lVar11].size_active != 0) {
          lVar21 = 0x60;
          uVar14 = 0;
          do {
            pCVar12 = (&local_178)[lVar11].items;
            *(undefined8 *)((long)pCVar12 + lVar21 + -0x60) =
                 *(undefined8 *)((long)pCVar19 + lVar21 + -0x60);
            puVar1 = (undefined8 *)((long)pCVar19 + lVar21 + -0x50);
            uVar8 = puVar1[1];
            puVar2 = (undefined8 *)((long)pCVar12 + lVar21 + -0x50);
            *puVar2 = *puVar1;
            puVar2[1] = uVar8;
            puVar1 = (undefined8 *)((long)pCVar19 + lVar21 + -0x40);
            uVar8 = puVar1[1];
            puVar2 = (undefined8 *)((long)pCVar12 + lVar21 + -0x40);
            *puVar2 = *puVar1;
            puVar2[1] = uVar8;
            puVar1 = (undefined8 *)((long)pCVar19 + lVar21 + -0x30);
            uVar8 = puVar1[1];
            puVar2 = (undefined8 *)((long)pCVar12 + lVar21 + -0x30);
            *puVar2 = *puVar1;
            puVar2[1] = uVar8;
            puVar1 = (undefined8 *)((long)pCVar19 + lVar21 + -0x20);
            uVar8 = puVar1[1];
            puVar2 = (undefined8 *)((long)pCVar12 + lVar21 + -0x20);
            *puVar2 = *puVar1;
            puVar2[1] = uVar8;
            puVar1 = (undefined8 *)((long)pCVar19 + lVar21 + -0x10);
            uVar8 = puVar1[1];
            puVar2 = (undefined8 *)((long)pCVar12 + lVar21 + -0x10);
            *puVar2 = *puVar1;
            puVar2[1] = uVar8;
            *(undefined8 *)((long)&(pCVar12->ref0).ptr + lVar21) =
                 *(undefined8 *)((long)&(pCVar19->ref0).ptr + lVar21);
            uVar14 = uVar14 + 1;
            lVar21 = lVar21 + 0x70;
          } while (uVar14 < (&local_178)[lVar11].size_active);
        }
        apuStack_190[0] = (undefined1 *)0xc873b3;
        alignedFree(pCVar19);
        (&local_178)[lVar11].size_active = 0;
        (&local_178)[lVar11].size_alloced = sVar6;
      }
      iVar16 = local_180;
      local_180 = iVar17;
    } while ((&local_178)[lVar23].size_active + 8 < 0x801);
  }
  local_d8.source = &local_180;
  last = (&local_178)[local_180].size_active;
  local_d8.jobs = (jobvector (*) [2])&local_178;
  local_d8.this = local_130;
  local_b8._12_2_ = 0x401;
  local_b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_b8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_b8.my_name = CUSTOM_CTX;
  apuStack_190[0] = (undefined1 *)0xc87434;
  tbb::detail::r1::initialize(&local_b8);
  local_c0.func = &local_d8;
  apuStack_190[0] = (undefined1 *)0xc87463;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,embree::parallel_for<unsigned_long,embree::sse2::BVHNCollider<4>::collide_recurse_entry(embree::NodeRefPtr<4>,embree::BBox<embree::Vec3fa>const&,embree::NodeRefPtr<4>,embree::BBox<embree::Vec3fa>const&)::_lambda(unsigned_long)_1_>(unsigned_long,embree::sse2::BVHNCollider<4>::collide_recurse_entry(embree::NodeRefPtr<4>,embree::BBox<embree::Vec3fa>const&,embree::NodeRefPtr<4>,embree::BBox<embree::Vec3fa>const&)::_lambda(unsigned_long)_1_const&)::_lambda(unsigned_long)_1_,tbb::detail::d1::auto_partitioner_const>
            (0,last,1,&local_c0,&local_179,&local_b8);
  apuStack_190[0] = (undefined1 *)0xc87470;
  cVar10 = tbb::detail::r1::is_group_execution_cancelled(&local_b8);
  if (cVar10 != '\0') {
    apuStack_190[0] = (undefined1 *)0xc874c3;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    apuStack_190[0] = (undefined1 *)0xc874d5;
    std::runtime_error::runtime_error(this_00,"task cancelled");
    apuStack_190[0] = &LAB_00c874eb;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  apuStack_190[0] = (undefined1 *)0xc87481;
  tbb::detail::r1::destroy(&local_b8);
  lVar11 = 0x40;
  do {
    apuStack_190[0] = (undefined1 *)0xc87490;
    alignedFree(*(void **)((long)&local_180 + lVar11));
    *(undefined8 *)((long)apuStack_190 + lVar11) = 0;
    *(undefined8 *)((long)apuStack_190 + lVar11 + 8) = 0;
    *(undefined8 *)((long)&local_180 + lVar11) = 0;
    lVar11 = lVar11 + -0x20;
  } while (lVar11 != 0);
  return;
}

Assistant:

void BVHNCollider<N>::collide_recurse_entry(NodeRef ref0, const BBox3fa& bounds0, NodeRef ref1, const BBox3fa& bounds1)
    {
      CSTAT(bvh_collide_traversal_steps = 0);
      CSTAT(bvh_collide_leaf_pairs = 0);
      CSTAT(bvh_collide_leaf_iterations = 0);
      CSTAT(bvh_collide_prim_intersections1 = 0);
      CSTAT(bvh_collide_prim_intersections2 = 0);
      CSTAT(bvh_collide_prim_intersections3 = 0);
      CSTAT(bvh_collide_prim_intersections4 = 0);
      CSTAT(bvh_collide_prim_intersections5 = 0);
      CSTAT(bvh_collide_prim_intersections = 0);
#if 0
      collide_recurse(ref0,bounds0,ref1,bounds1,0,0);
#else
      const int M = 2048;
      jobvector jobs[2];
      jobs[0].reserve(M);
      jobs[1].reserve(M);
      jobs[0].push_back(CollideJob(ref0,bounds0,0,ref1,bounds1,0));
      int source = 0;
      int target = 1;

      /* try to split job until job list is full */
      while (jobs[source].size()+8 <= M)
      {
        for (size_t i=0; i<jobs[source].size(); i++)
        {
          const CollideJob& job = jobs[source][i];
          size_t remaining = jobs[source].size()-i;
          if (jobs[target].size()+remaining+8 > M) {
            jobs[target].push_back(job);
          } else {
            split(job,jobs[target]);
          }
        }

        /* stop splitting jobs if we reached only leaves and cannot make progress anymore */
        if (jobs[target].size() == jobs[source].size())
          break;

        jobs[source].resize(0);
        std::swap(source,target);
      }

      /* parallel processing of all jobs */
      parallel_for(size_t(jobs[source].size()), [&] ( size_t i ) {
          CollideJob& j = jobs[source][i];
          collide_recurse(j.ref0,j.bounds0,j.ref1,j.bounds1,j.depth0,j.depth1);
        });
      
      
#endif
      CSTAT(PRINT(bvh_collide_traversal_steps));
      CSTAT(PRINT(bvh_collide_leaf_pairs));
      CSTAT(PRINT(bvh_collide_leaf_iterations));
      CSTAT(PRINT(bvh_collide_prim_intersections1));
      CSTAT(PRINT(bvh_collide_prim_intersections2));
      CSTAT(PRINT(bvh_collide_prim_intersections3));
      CSTAT(PRINT(bvh_collide_prim_intersections4));
      CSTAT(PRINT(bvh_collide_prim_intersections5));
      CSTAT(PRINT(bvh_collide_prim_intersections));
    }